

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O0

void vrna_aln_encode(char *sequence,short **S_p,short **s5_p,short **s3_p,char **ss_p,uint **as_p,
                    vrna_md_t *md)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  short *psVar4;
  uint *puVar5;
  char *pcVar6;
  uint local_44;
  char c3_1;
  char c5_1;
  char c3;
  char c5;
  uint p;
  uint l;
  uint i;
  uint **as_p_local;
  char **ss_p_local;
  short **s3_p_local;
  short **s5_p_local;
  short **S_p_local;
  char *sequence_local;
  
  sVar3 = strlen(sequence);
  uVar2 = (uint)sVar3;
  psVar4 = (short *)vrna_alloc((uVar2 + 2) * 2);
  *s5_p = psVar4;
  psVar4 = (short *)vrna_alloc((uVar2 + 2) * 2);
  *s3_p = psVar4;
  puVar5 = (uint *)vrna_alloc((uVar2 + 2) * 4);
  *as_p = puVar5;
  pcVar6 = (char *)vrna_alloc(uVar2 + 2);
  *ss_p = pcVar6;
  psVar4 = vrna_seq_encode_simple(sequence,md);
  *S_p = psVar4;
  (*s5_p)[1] = 0;
  **s5_p = 0;
  if (md->oldAliEn == 0) {
    p = uVar2;
    if (md->circ == 0) {
      (*s3_p)[sVar3 & 0xffffffff] = 0;
      (*s5_p)[1] = 0;
    }
    else {
      for (; p != 0; p = p - 1) {
        cVar1 = sequence[p - 1];
        if ((((cVar1 != '-') && (cVar1 != '_')) && (cVar1 != '~')) && (cVar1 != '.')) {
          (*s5_p)[1] = (*S_p)[p];
          break;
        }
      }
      for (p = 1; p <= uVar2; p = p + 1) {
        cVar1 = sequence[p - 1];
        if (((cVar1 != '-') && (cVar1 != '_')) && ((cVar1 != '~' && (cVar1 != '.')))) {
          (*s3_p)[sVar3 & 0xffffffff] = (*S_p)[p];
          break;
        }
      }
    }
    local_44 = 0;
    for (p = 1; p <= uVar2; p = p + 1) {
      cVar1 = sequence[p - 1];
      if (((cVar1 == '-') || (cVar1 == '_')) || ((cVar1 == '~' || (cVar1 == '.')))) {
        (*s5_p)[p + 1] = (*s5_p)[p];
      }
      else {
        (*ss_p)[local_44] = sequence[p - 1];
        (*s5_p)[p + 1] = (*S_p)[p];
        local_44 = local_44 + 1;
      }
      (*as_p)[p] = local_44;
    }
    while (p = uVar2, p != 0) {
      cVar1 = sequence[p - 1];
      if ((((cVar1 == '-') || (cVar1 == '_')) || (cVar1 == '~')) || (cVar1 == '.')) {
        (*s3_p)[p - 1] = (*s3_p)[p];
      }
      else {
        (*s3_p)[p - 1] = (*S_p)[p];
      }
      uVar2 = p - 1;
    }
  }
  else {
    **ss_p = *sequence;
    for (p = 1; p < uVar2; p = p + 1) {
      (*s5_p)[p] = (*S_p)[p - 1];
      (*s3_p)[p] = (*S_p)[p + 1];
      (*ss_p)[p] = sequence[p];
      (*as_p)[p] = p;
    }
    (*ss_p)[sVar3 & 0xffffffff] = sequence[sVar3 & 0xffffffff];
    (*as_p)[sVar3 & 0xffffffff] = uVar2;
    (*s5_p)[sVar3 & 0xffffffff] = (*S_p)[uVar2 - 1];
    (*s3_p)[sVar3 & 0xffffffff] = 0;
    (*S_p)[uVar2 + 1] = (*S_p)[1];
    (*s5_p)[1] = 0;
    if (md->circ != 0) {
      (*s5_p)[1] = (*S_p)[sVar3 & 0xffffffff];
      (*s3_p)[sVar3 & 0xffffffff] = (*S_p)[1];
      (*ss_p)[uVar2 + 1] = (char)(*S_p)[1];
    }
  }
  return;
}

Assistant:

PUBLIC void
vrna_aln_encode(const char    *sequence,
                short         **S_p,
                short         **s5_p,
                short         **s3_p,
                char          **ss_p,
                unsigned int  **as_p,
                vrna_md_t     *md)
{
  unsigned int i, l, p;

  l = strlen(sequence);

  (*s5_p) = (short *)vrna_alloc((l + 2) * sizeof(short));
  (*s3_p) = (short *)vrna_alloc((l + 2) * sizeof(short));
  (*as_p) = (unsigned int *)vrna_alloc((l + 2) * sizeof(unsigned int));
  (*ss_p) = (char *)vrna_alloc((l + 2) * sizeof(char));

  /* make numerical encoding of sequence */
  (*S_p) = vrna_seq_encode_simple(sequence, md);

  (*s5_p)[0] = (*s5_p)[1] = 0;

  if (md->oldAliEn) {
    /* use alignment sequences in all energy evaluations */
    (*ss_p)[0] = sequence[0];
    for (i = 1; i < l; i++) {
      (*s5_p)[i]  = (*S_p)[i - 1];
      (*s3_p)[i]  = (*S_p)[i + 1];
      (*ss_p)[i]  = sequence[i];
      (*as_p)[i]  = i;
    }
    (*ss_p)[l]    = sequence[l];
    (*as_p)[l]    = l;
    (*s5_p)[l]    = (*S_p)[l - 1];
    (*s3_p)[l]    = 0;
    (*S_p)[l + 1] = (*S_p)[1];
    (*s5_p)[1]    = 0;
    if (md->circ) {
      (*s5_p)[1]      = (*S_p)[l];
      (*s3_p)[l]      = (*S_p)[1];
      (*ss_p)[l + 1]  = (*S_p)[1];
    }
  } else {
    if (md->circ) {
      for (i = l; i > 0; i--) {
        char c5;
        c5 = sequence[i - 1];
        if ((c5 == '-') || (c5 == '_') || (c5 == '~') || (c5 == '.'))
          continue;

        (*s5_p)[1] = (*S_p)[i];
        break;
      }
      for (i = 1; i <= l; i++) {
        char c3;
        c3 = sequence[i - 1];
        if ((c3 == '-') || (c3 == '_') || (c3 == '~') || (c3 == '.'))
          continue;

        (*s3_p)[l] = (*S_p)[i];
        break;
      }
    } else {
      (*s5_p)[1] = (*s3_p)[l] = 0;
    }

    for (i = 1, p = 0; i <= l; i++) {
      char c5;
      c5 = sequence[i - 1];
      if ((c5 == '-') || (c5 == '_') || (c5 == '~') || (c5 == '.')) {
        (*s5_p)[i + 1] = (*s5_p)[i];
      } else {
        /* no gap */
        (*ss_p)[p++]    = sequence[i - 1]; /*start at 0!!*/
        (*s5_p)[i + 1]  = (*S_p)[i];
      }

      (*as_p)[i] = p;
    }
    for (i = l; i >= 1; i--) {
      char c3;
      c3 = sequence[i - 1];
      if ((c3 == '-') || (c3 == '_') || (c3 == '~') || (c3 == '.'))
        (*s3_p)[i - 1] = (*s3_p)[i];
      else
        (*s3_p)[i - 1] = (*S_p)[i];
    }
  }
}